

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O2

plutovg_surface_t *
plutosvg_document_render_to_surface
          (plutosvg_document_t *document,char *id,int width,int height,
          plutovg_color_t *current_color,plutosvg_palette_func_t palette_func,void *closure)

{
  undefined8 uVar1;
  _Bool _Var2;
  plutovg_surface_t *surface;
  plutovg_canvas_t *canvas;
  float fVar3;
  plutovg_rect_t local_78;
  plutovg_color_t *local_68;
  plutosvg_palette_func_t local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_78.x = 0.0;
  local_78.y = 0.0;
  uVar1._0_4_ = document->width;
  uVar1._4_4_ = document->height;
  fVar3 = (float)uVar1;
  local_58 = uVar1._4_4_;
  local_78._8_8_ = uVar1;
  if (id != (char *)0x0) {
    _Var2 = plutosvg_document_extents(document,id,&local_78);
    if (!_Var2) {
      return (plutovg_surface_t *)0x0;
    }
    uVar1._4_4_ = 0.0;
    fVar3 = local_78.w;
    local_58 = local_78.h;
  }
  if (fVar3 <= 0.0) {
    return (plutovg_surface_t *)0x0;
  }
  if (local_58 <= 0.0) {
    return (plutovg_surface_t *)0x0;
  }
  local_48 = CONCAT44(uVar1._4_4_,fVar3);
  uStack_40 = 0;
  local_68 = current_color;
  fStack_54 = uVar1._4_4_;
  fStack_50 = uVar1._4_4_;
  fStack_4c = uVar1._4_4_;
  if (height < 1 && width < 1) {
    uVar1._4_4_ = ceilf(fVar3);
    width = (int)uVar1._4_4_;
    fVar3 = local_58;
  }
  else {
    if (width < 1 || 0 < height) {
      if (0 < height && width < 1) {
        uVar1._4_4_ = ceilf(((float)height * fVar3) / local_58);
        width = (int)uVar1._4_4_;
      }
      goto LAB_001056cb;
    }
    fVar3 = ((float)width * local_58) / fVar3;
  }
  uVar1._4_4_ = ceilf(fVar3);
  height = (int)uVar1._4_4_;
LAB_001056cb:
  surface = plutovg_surface_create(width,height);
  if (surface != (plutovg_surface_t *)0x0) {
    canvas = plutovg_canvas_create(surface);
    local_60 = palette_func;
    plutovg_canvas_scale(canvas,(float)width / (float)local_48,(float)height / local_58);
    plutovg_canvas_translate(canvas,-local_78.x,-local_78.y);
    _Var2 = plutosvg_document_render(document,id,canvas,local_68,local_60,closure);
    plutovg_canvas_destroy(canvas);
    if (_Var2) {
      return surface;
    }
    plutovg_surface_destroy(surface);
  }
  return (plutovg_surface_t *)0x0;
}

Assistant:

plutovg_surface_t* plutosvg_document_render_to_surface(const plutosvg_document_t* document, const char* id, int width, int height, const plutovg_color_t* current_color, plutosvg_palette_func_t palette_func, void* closure)
{
    plutovg_rect_t extents = {0, 0, document->width, document->height};
    if(id && !plutosvg_document_extents(document, id, &extents))
        return NULL;
    if(extents.w <= 0.f || extents.h <= 0.f)
        return NULL;
    if(width <= 0 && height <= 0) {
        width = (int)(ceilf(extents.w));
        height = (int)(ceilf(extents.h));
    } else if(width > 0 && height <= 0) {
        height = (int)(ceilf(width * extents.h / extents.w));
    } else if(height > 0 && width <= 0) {
        width = (int)(ceilf(height * extents.w / extents.h));
    }

    plutovg_surface_t* surface = plutovg_surface_create(width, height);
    if(surface == NULL)
        return NULL;
    plutovg_canvas_t* canvas = plutovg_canvas_create(surface);
    plutovg_canvas_scale(canvas, width / extents.w, height / extents.h);
    plutovg_canvas_translate(canvas, -extents.x, -extents.y);
    if(!plutosvg_document_render(document, id, canvas, current_color, palette_func, closure)) {
        plutovg_canvas_destroy(canvas);
        plutovg_surface_destroy(surface);
        return NULL;
    }

    plutovg_canvas_destroy(canvas);
    return surface;
}